

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

ggml_backend_buffer_type_t __thiscall llama_model::select_buft(llama_model *this,int il)

{
  impl *piVar1;
  long *plVar2;
  undefined8 uVar3;
  long lVar4;
  unique_ptr<ggml_context,_ggml_context_deleter> uVar5;
  char cVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 extraout_RAX;
  ulong uVar10;
  runtime_error *prVar11;
  long lVar12;
  undefined8 *puVar13;
  ggml_backend_buffer_type_t unaff_R14;
  ggml_backend_buffer_type_t pgVar14;
  ggml_context_ptr ctx;
  unique_ptr<ggml_context,_ggml_context_deleter> local_88;
  llama_model *local_80;
  string local_78;
  ulong local_58;
  undefined8 *local_50;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  piVar1 = (this->pimpl)._M_t.
           super___uniq_ptr_impl<llama_model::impl,_std::default_delete<llama_model::impl>_>._M_t.
           super__Tuple_impl<0UL,_llama_model::impl_*,_std::default_delete<llama_model::impl>_>.
           super__Head_base<0UL,_llama_model::impl_*,_false>._M_head_impl;
  lVar9 = *(long *)&(piVar1->dev_layer).
                    super__Vector_base<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>
                    ._M_impl;
  local_80 = this;
  if ((ulong)((long)*(pointer *)
                     ((long)&(piVar1->dev_layer).
                             super__Vector_base<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>
                     + 8) - lVar9 >> 4) <= (ulong)(long)il) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  plVar2 = *(long **)(lVar9 + 8 + (long)il * 0x10);
  puVar13 = (undefined8 *)*plVar2;
  local_50 = (undefined8 *)plVar2[1];
  uVar10 = (ulong)(puVar13 == local_50);
  pgVar14 = unaff_R14;
  if (puVar13 != local_50) {
    uVar10 = 0;
    do {
      uVar3 = *puVar13;
      pgVar14 = (ggml_backend_buffer_type_t)puVar13[1];
      local_58 = uVar10;
      local_48 = ggml_tensor_overhead();
      local_48 = local_48 << 3;
      uStack_40 = 0;
      local_38 = 1;
      local_88._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
           (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)ggml_init();
      if ((tuple<ggml_context_*,_ggml_context_deleter>)
          local_88._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ggml_context_*,_false>)0x0) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&local_78,"failed to create ggml context");
        std::runtime_error::runtime_error(prVar11,(string *)&local_78);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_78._M_dataplus._M_p = (pointer)ggml_backend_buft_alloc_buffer(pgVar14,0);
      uVar5._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
           local_88._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
      uVar7 = ggml_new_tensor_1d(local_88._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                                 (local_80->hparams).n_embd);
      uVar8 = ggml_new_tensor_1d(uVar5._M_t.
                                 super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                                 (local_80->hparams).n_embd);
      lVar9 = ggml_add(uVar5._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar7,uVar8);
      lVar12 = 0x13;
      do {
        lVar4 = *(long *)(lVar9 + lVar12 * 8);
        if (lVar4 != 0) {
          *(pointer *)(lVar4 + 8) = local_78._M_dataplus._M_p;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x1d);
      cVar6 = ggml_backend_dev_supports_op(uVar3);
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_78);
      std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&local_88);
      uVar10 = local_58;
      if (cVar6 != '\0') break;
      puVar13 = puVar13 + 2;
      uVar10 = CONCAT71((int7)((ulong)extraout_RAX >> 8),puVar13 == local_50);
      pgVar14 = unaff_R14;
    } while (puVar13 != local_50);
  }
  if ((uVar10 & 1) == 0) {
    return pgVar14;
  }
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&local_78,"no suitable buffer type found");
  std::runtime_error::runtime_error(prVar11,(string *)&local_78);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ggml_backend_buffer_type_t llama_model::select_buft(int il) const {
    return ::select_buft(
            *pimpl->dev_layer.at(il).buft_list,
            [&](ggml_context * ctx) {
                ggml_tensor * cur = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, hparams.n_embd);
                ggml_tensor * layer_dir = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, hparams.n_embd);
                return ggml_add(ctx, cur, layer_dir);
            });
}